

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::reallocateTo
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,size_type newCapacity)

{
  Entry *__last;
  EVP_PKEY_CTX *ctx;
  Entry *in_RSI;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *in_RDI;
  pointer newData;
  
  __last = (Entry *)operator_new(0x819f46);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::
  uninitialized_move<slang::ast::OpaqueInstancePath::Entry*,slang::ast::OpaqueInstancePath::Entry*>
            (in_RSI,__last,(Entry *)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }